

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ipc.c
# Opt level: O3

void spawn_helper(uv_pipe_t *channel,uv_process_t *process,char *helper)

{
  int iVar1;
  uv_loop_t *puVar2;
  undefined8 uVar3;
  int extraout_EDX;
  undefined8 *extraout_RDX;
  uv_pipe_t *puVar4;
  code *pcVar5;
  ulong uVar6;
  char *helper_00;
  size_t exepath_size;
  char *args [3];
  uv_stdio_container_t stdio [3];
  char exepath [1024];
  uv_process_t uStack_580;
  uv_loop_t *puStack_4f8;
  uv_pipe_t *puStack_4f0;
  code *pcStack_4e8;
  uv_process_t *puStack_4e0;
  uv_pipe_t *puStack_4d8;
  undefined1 local_4c0 [8];
  uv_loop_t *local_4b8;
  char *local_4b0;
  uv_close_cb local_4a8;
  undefined4 local_498 [2];
  anon_union_32_2_8d26fa8b_for_u local_490;
  undefined4 local_470;
  code *local_468;
  uv_loop_t *local_460;
  uv_alloc_cb local_458;
  uv_read_cb local_450;
  uv_connect_t *puStack_448;
  uv_shutdown_t *local_440;
  uv__io_cb p_Stack_438;
  void *local_430;
  uv_loop_t local_428;
  
  puVar2 = (uv_loop_t *)uv_default_loop();
  puVar4 = channel;
  iVar1 = uv_pipe_init(puVar2,channel,1);
  if (iVar1 == 0) {
    if (channel->ipc == 0) goto LAB_0016242c;
    puVar4 = (uv_pipe_t *)local_4c0;
    local_4c0 = (undefined1  [8])0x400;
    puVar2 = &local_428;
    iVar1 = uv_exepath();
    if (iVar1 != 0) goto LAB_00162431;
    *(undefined1 *)((long)local_4c0 + (long)(local_428.handle_queue + -2)) = 0;
    local_458 = (uv_alloc_cb)(local_4c0 + 8);
    local_4a8 = (uv_close_cb)0x0;
    local_450 = (uv_read_cb)0x0;
    puStack_448 = (uv_connect_t *)0x0;
    local_430 = (void *)0x0;
    local_468 = exit_cb;
    p_Stack_438 = (uv__io_cb)local_498;
    local_440 = (uv_shutdown_t *)0x300000000;
    local_498[0] = 0x31;
    local_490._8_4_ = 2;
    local_490._16_4_ = 1;
    local_490._24_4_ = 2;
    local_470 = 2;
    local_4b8 = &local_428;
    local_4b0 = helper;
    local_490.reserved[0] = channel;
    local_460 = &local_428;
    puVar2 = (uv_loop_t *)uv_default_loop();
    puVar4 = (uv_pipe_t *)process;
    iVar1 = uv_spawn(puVar2,process,&local_468);
    if (iVar1 == 0) {
      return;
    }
  }
  else {
    spawn_helper_cold_1();
LAB_0016242c:
    spawn_helper_cold_4();
LAB_00162431:
    spawn_helper_cold_2();
  }
  spawn_helper_cold_3();
  pcStack_4e8 = (code *)0x162453;
  puStack_4e0 = process;
  puStack_4d8 = channel;
  puts("exit_cb");
  exit_cb_called = exit_cb_called + 1;
  if (puVar4 == (uv_pipe_t *)0x0) {
    if (extraout_EDX == 0) {
      uv_close(puVar2,0);
      return;
    }
  }
  else {
    pcStack_4e8 = (code *)0x162475;
    exit_cb_cold_1();
  }
  pcStack_4e8 = run_test_ipc_listen_before_write;
  exit_cb_cold_2();
  helper_00 = "ipc_helper_listen_before_write";
  pcVar5 = on_read;
  puStack_4f0 = (uv_pipe_t *)0x16248e;
  run_ipc_test("ipc_helper_listen_before_write",on_read);
  if (local_conn_accepted == '\0') {
    puStack_4f0 = (uv_pipe_t *)0x1624bb;
    run_test_ipc_listen_before_write_cold_1();
LAB_001624bb:
    puStack_4f0 = (uv_pipe_t *)0x1624c0;
    run_test_ipc_listen_before_write_cold_2();
  }
  else {
    if (remote_conn_accepted == '\0') goto LAB_001624bb;
    if (read_cb_called == 1) {
      if (exit_cb_called == 1) {
        return;
      }
      goto LAB_001624c5;
    }
  }
  puStack_4f0 = (uv_pipe_t *)0x1624c5;
  run_test_ipc_listen_before_write_cold_3();
LAB_001624c5:
  puStack_4f0 = (uv_pipe_t *)run_ipc_test;
  run_test_ipc_listen_before_write_cold_4();
  puStack_4f8 = puVar2;
  puStack_4f0 = puVar4;
  spawn_helper(&::channel,&uStack_580,helper_00);
  uv_read_start(&::channel,on_alloc,pcVar5);
  uVar3 = uv_default_loop();
  uVar6 = 0;
  iVar1 = uv_run(uVar3);
  if (iVar1 == 0) {
    uVar3 = uv_default_loop();
    uv_walk(uVar3,close_walk_cb,0);
    uVar6 = 0;
    uv_run(uVar3);
    uVar3 = uv_default_loop();
    iVar1 = uv_loop_close(uVar3);
    if (iVar1 == 0) {
      return;
    }
  }
  else {
    run_ipc_test_cold_1();
  }
  run_ipc_test_cold_2();
  if (uVar6 != 0) {
    if (-1 < (long)uVar6) {
      on_read_cold_1();
      return;
    }
    if (uVar6 != 0xfffffffffffff001) {
      uVar3 = uv_strerror(uVar6 & 0xffffffff);
      printf("error recving on channel: %s\n",uVar3);
      abort();
    }
  }
  free((void *)*extraout_RDX);
  return;
}

Assistant:

void spawn_helper(uv_pipe_t* channel,
                  uv_process_t* process,
                  const char* helper) {
  uv_process_options_t options;
  size_t exepath_size;
  char exepath[1024];
  char* args[3];
  int r;
  uv_stdio_container_t stdio[3];

  r = uv_pipe_init(uv_default_loop(), channel, 1);
  ASSERT(r == 0);
  ASSERT(channel->ipc);

  exepath_size = sizeof(exepath);
  r = uv_exepath(exepath, &exepath_size);
  ASSERT(r == 0);

  exepath[exepath_size] = '\0';
  args[0] = exepath;
  args[1] = (char*)helper;
  args[2] = NULL;

  memset(&options, 0, sizeof(options));
  options.file = exepath;
  options.args = args;
  options.exit_cb = exit_cb;
  options.stdio = stdio;
  options.stdio_count = ARRAY_SIZE(stdio);

  stdio[0].flags = UV_CREATE_PIPE | UV_READABLE_PIPE | UV_WRITABLE_PIPE;
  stdio[0].data.stream = (uv_stream_t*) channel;
  stdio[1].flags = UV_INHERIT_FD;
  stdio[1].data.fd = 1;
  stdio[2].flags = UV_INHERIT_FD;
  stdio[2].data.fd = 2;

  r = uv_spawn(uv_default_loop(), process, &options);
  ASSERT(r == 0);
}